

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

char * CVmObjBigNum::cache_ln10(size_t prec)

{
  uint uVar1;
  size_t sVar2;
  undefined8 *puVar3;
  long *plVar4;
  char *unaff_RBX;
  long in_RDI;
  err_frame_t err_cur__;
  char *ext5;
  char *ext4;
  char *ext3;
  char *ext2;
  char *ext1;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  int expanded;
  char *ext;
  size_t in_stack_fffffffffffffe68;
  CVmBigNumCache *in_stack_fffffffffffffe70;
  int round;
  char *src;
  uint *dst;
  uint *ext5_00;
  char *in_stack_fffffffffffffe98;
  void *pvVar5;
  char *in_stack_fffffffffffffea0;
  undefined8 uVar6;
  CVmBigNumCache *ext2_00;
  undefined4 in_stack_fffffffffffffeb4;
  void *local_140;
  char local_68 [8];
  undefined1 local_60 [8];
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  char *local_30;
  ulong local_28;
  char *in_stack_ffffffffffffffe0;
  
  local_28 = in_RDI + 7U & 0xfffffffffffffff8;
  ext2_00 = S_bignum_cache;
  calc_alloc(local_28);
  local_30 = CVmBigNumCache::get_ln10_reg
                       (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,(int *)0x2ba1ad);
  if (local_30 != (char *)0x0) {
    if ((local_34 != 0) || (sVar2 = get_prec((char *)0x2ba1e1), sVar2 < local_28)) {
      set_prec((char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      round = (int)((ulong)&local_40 >> 0x20);
      src = local_68;
      dst = &local_44;
      ext5_00 = &local_48;
      alloc_temp_regs(local_28 + 3,5,&stack0xffffffffffffffb0,&local_38,&stack0xffffffffffffffa8,
                      &local_3c,local_60);
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      uVar6 = *puVar3;
      plVar4 = (long *)_ZTW11G_err_frame();
      *plVar4 = (long)&stack0xfffffffffffffeb0;
      uVar1 = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffec8);
      if (uVar1 == 0) {
        copy_val((char *)dst,src,round);
        compute_sqrt_into(unaff_RBX,in_stack_ffffffffffffffe0);
        compute_ln_series_into
                  ((char *)CONCAT44(in_stack_fffffffffffffeb4,uVar1),(char *)ext2_00,
                   in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(char *)ext5_00);
        mul_by_long(in_stack_fffffffffffffea0,(unsigned_long)in_stack_fffffffffffffe98);
        copy_val((char *)dst,src,round);
      }
      if ((uVar1 & 0x8000) == 0) {
        release_temp_regs(5,(ulong)local_38,(ulong)local_3c,(ulong)local_40,(ulong)local_44,
                          (ulong)local_48);
      }
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      *puVar3 = uVar6;
      if ((uVar1 & 0x4001) != 0) {
        puVar3 = (undefined8 *)_ZTW11G_err_frame();
        if ((*(uint *)*puVar3 & 2) != 0) {
          plVar4 = (long *)_ZTW11G_err_frame();
          free(*(void **)(*plVar4 + 0x10));
        }
        pvVar5 = local_140;
        plVar4 = (long *)_ZTW11G_err_frame();
        *(void **)(*plVar4 + 0x10) = pvVar5;
        err_rethrow();
      }
      if ((uVar1 & 2) != 0) {
        free(local_140);
      }
    }
    return local_30;
  }
  err_throw(0);
}

Assistant:

const char *CVmObjBigNum::cache_ln10(size_t prec)
{
    char *ext;
    int expanded;
    uint hdl1, hdl2, hdl3, hdl4, hdl5;
    char *ext1, *ext2, *ext3, *ext4, *ext5;
    static const unsigned char ten[] =
    {
        /* number of digits */
        0x01, 0x00,

        /* exponent (0.1 * 10^2 = 10) */
        0x02, 0x00,

        /* flags */
        0x00,

        /* mantissa */
        0x10
    };

    /* 
     *   round up the precision a bit to ensure that we don't have to
     *   repeatedly recalculate this value if we're asked for a cluster of
     *   similar precisions 
     */
    prec = (prec + 7) & ~7;
    
    /* get the ln10 cache register */
    ext = S_bignum_cache->get_ln10_reg(calc_alloc(prec), &expanded);

    /* if that failed, throw an error */
    if (ext == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* 
     *   if we didn't have to allocate more memory, and the value in the
     *   register has at least the required precision, return the cached
     *   value 
     */
    if (!expanded && get_prec(ext) >= prec)
        return ext;

    /* 
     *   we have reallocated the register, or we just didn't have enough
     *   precision in the old value - set the new precision 
     */
    set_prec(ext, prec);

    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 5,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        /* 
         *   Compute sqrt(10) - 10 is too large for the series to converge,
         *   but sqrt(10) is good.  We'll correct for this later by doubling
         *   the result of the series expansion, which gives us the correct
         *   result: ln(a^b) = b*ln(a), and sqrt(x) = x^(1/2), hence
         *   ln(sqrt(x)) = ln(x)/2, which means that ln(x) = 2*ln(sqrt(x)).
         *   
         *   Note that we have to do this the hard way, by explicitly doing
         *   the ln series rather than just calling compute_ln_into() to get
         *   the value directly.  Why?  Because compute_ln_into() needs the
         *   cached value of ln(10) to do its work.  If we called
         *   compute_ln_into() here, we'd get stuck in a recursion loop.  
         */

        /* compute sqrt(10), for quick series convergence */
        copy_val(ext2, (const char *)ten, FALSE);
        compute_sqrt_into(ext1, ext2);

        /* compute the series expansion */
        ext1 = compute_ln_series_into(ext1, ext2, ext3, ext4, ext5);

        /* double the result (to adjust for the sqrt) */
        mul_by_long(ext1, 2);

        /* store the result in the cache */
        copy_val(ext, ext1, TRUE);
    }